

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall
FlowGraph::InsertEdgeFromFinallyToEarlyExit
          (FlowGraph *this,BasicBlock *finallyEndBlock,LabelInstr *exitLabel)

{
  code *pcVar1;
  LabelInstr *pLVar2;
  bool bVar3;
  undefined4 *puVar4;
  BasicBlock *pBVar5;
  LabelInstr *instr;
  Instr *pIVar6;
  BranchInstr *pBVar7;
  LabelInstr *instr_00;
  FlowEdge *pFVar8;
  long lVar9;
  Func **ppFVar10;
  FlowGraph *this_00;
  Region *local_60;
  BasicBlock *local_58;
  BasicBlock *local_50;
  LabelInstr *local_48;
  LabelInstr *local_40;
  Instr *local_38;
  
  pBVar5 = finallyEndBlock->next;
  ppFVar10 = (Func **)&pBVar5->firstInstr;
  if (pBVar5 == (BasicBlock *)0x0) {
    ppFVar10 = &finallyEndBlock->func;
  }
  lVar9 = 0x18;
  if (pBVar5 == (BasicBlock *)0x0) {
    lVar9 = 0xd0;
  }
  pIVar6 = *(Instr **)((long)&(*ppFVar10)->m_alloc + lVar9);
  local_48 = exitLabel;
  local_40 = IR::Instr::AsLabelInstr(finallyEndBlock->firstInstr);
  local_38 = pIVar6;
  if ((1 < pIVar6->m_opcode - 0xea) && (pIVar6->m_opcode != BrOnException)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x2b5,
                       "(lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException)"
                       ,
                       "lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pBVar5 = BasicBlock::GetNext(finallyEndBlock);
  instr = IR::LabelInstr::New(Label,this->func,false);
  pIVar6 = local_38;
  IR::Instr::InsertBefore(local_38,&instr->super_Instr);
  local_50 = pBVar5;
  AddBlock(this,&instr->super_Instr,pIVar6,pBVar5,finallyEndBlock);
  instr->m_region = local_40->m_region;
  AddEdge(this,finallyEndBlock,instr->m_block);
  pIVar6 = IR::Instr::GetPrevRealInstrOrLabel(pIVar6);
  instr_00 = local_48;
  if ((pIVar6->m_kind == InstrKindLabel) || (pIVar6->m_kind == InstrKindProfiledLabel)) {
    pBVar7 = IR::BranchInstr::New(BrOnException,local_48,this->func);
    IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,local_38);
    pBVar7->field_0x58 = pBVar7->field_0x58 | 0x10;
    IR::Instr::InsertBefore(&instr->super_Instr,&pBVar7->super_Instr);
  }
  else {
    instr_00 = IR::LabelInstr::New(Label,this->func,false);
    IR::Instr::InsertBefore(&instr->super_Instr,&instr_00->super_Instr);
    pBVar7 = IR::BranchInstr::New(BrOnException,local_48,this->func);
    pBVar7->field_0x58 = pBVar7->field_0x58 | 0x10;
    IR::Instr::SetByteCodeOffset(&pBVar7->super_Instr,local_38);
    IR::Instr::InsertBefore(&instr->super_Instr,&pBVar7->super_Instr);
    pBVar5 = BasicBlock::GetNext(finallyEndBlock);
    AddBlock(this,&instr_00->super_Instr,&pBVar7->super_Instr,pBVar5,finallyEndBlock);
    instr_00->m_region = local_40->m_region;
  }
  pLVar2 = local_40;
  this_00 = this;
  AddEdge(this,finallyEndBlock,instr_00->m_block);
  pBVar5 = local_50;
  pFVar8 = FindEdge(this_00,finallyEndBlock,local_50);
  if (pFVar8 != (FlowEdge *)0x0) {
    BasicBlock::RemoveSucc(finallyEndBlock,pBVar5,this);
  }
  local_60 = pLVar2->m_region;
  local_58 = instr->m_block;
  JsUtil::
  BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this->regToFinallyEndMap,&local_60,&local_58);
  return;
}

Assistant:

void FlowGraph::InsertEdgeFromFinallyToEarlyExit(BasicBlock *finallyEndBlock, IR::LabelInstr *exitLabel)
{
    IR::Instr * lastInstr = finallyEndBlock->GetLastInstr();
    IR::LabelInstr * lastLabel = finallyEndBlock->GetFirstInstr()->AsLabelInstr();

    Assert(lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException);
    // Add a new block, add BrOnException to earlyexit, assign region
    // Finally
    // ...
    // L1:
    // LeaveNull
    // to
    // Finally
    // ...
    // L1:
    // BrOnException earlyExitLabel
    // L1':
    // LeaveNull

    BasicBlock *nextBB = finallyEndBlock->GetNext();

    IR::LabelInstr *leaveLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
    lastInstr->InsertBefore(leaveLabel);

    this->AddBlock(leaveLabel, lastInstr, nextBB, finallyEndBlock /*prevBlock*/);
    leaveLabel->SetRegion(lastLabel->GetRegion());

    this->AddEdge(finallyEndBlock, leaveLabel->GetBasicBlock());

    // If the Leave/LeaveNull at the end of finally was not preceeded by a Label, we have to create a new block with BrOnException to early exit
    if (!lastInstr->GetPrevRealInstrOrLabel()->IsLabelInstr())
    {
        IR::LabelInstr *brLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
        leaveLabel->InsertBefore(brLabel);

        IR::BranchInstr *brToExit = IR::BranchInstr::New(Js::OpCode::BrOnException, exitLabel, this->func);
        brToExit->m_brFinallyToEarlyExit = true;
        brToExit->SetByteCodeOffset(lastInstr);
        leaveLabel->InsertBefore(brToExit);

        this->AddBlock(brLabel, brToExit, finallyEndBlock->GetNext(), finallyEndBlock /*prevBlock*/);
        brLabel->SetRegion(lastLabel->GetRegion());

        this->AddEdge(finallyEndBlock, brLabel->GetBasicBlock());
    }
    else
    {
        // If the Leave/LeaveNull at the end of finally was preceeded by a Label, we reuse the block inserting BrOnException to early exit in it
        IR::BranchInstr *brToExit = IR::BranchInstr::New(Js::OpCode::BrOnException, exitLabel, this->func);
        brToExit->SetByteCodeOffset(lastInstr);
        brToExit->m_brFinallyToEarlyExit = true;
        leaveLabel->InsertBefore(brToExit);
        this->AddEdge(finallyEndBlock, exitLabel->GetBasicBlock());
    }

    // In case of throw/non-terminating loop, there maybe no edge to the next block
    if (this->FindEdge(finallyEndBlock, nextBB))
    {
        finallyEndBlock->RemoveSucc(nextBB, this);
    }

    this->regToFinallyEndMap->Item(lastLabel->GetRegion(), leaveLabel->GetBasicBlock());
}